

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O2

void Window_To_Buffer(WINDOW_conflict *win,FIELD *field)

{
  undefined2 uVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  short sVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  
  if (((win != (WINDOW_conflict *)0x0) && (field != (FIELD *)0x0)) &&
     (pcVar3 = field->buf, pcVar3 != (char *)0x0)) {
    iVar2 = field->pad;
    uVar1 = win->_maxy;
    sVar6 = -1;
    if (-1 < (short)uVar1) {
      sVar6 = uVar1;
    }
    uVar8 = 0;
    for (iVar7 = 0; (sVar6 + 1 != iVar7 && (iVar7 < field->drows)); iVar7 = iVar7 + 1) {
      wmove(win,iVar7,0);
      iVar4 = winnstr(win,pcVar3 + (int)uVar8,field->dcols);
      uVar8 = uVar8 + iVar4;
    }
    pcVar3[(int)uVar8] = '\0';
    if (iVar2 != 0x20) {
      uVar5 = 0;
      uVar9 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar9 = uVar5;
      }
      for (; (int)uVar9 != (int)uVar5; uVar5 = uVar5 + 1) {
        if (iVar2 == pcVar3[uVar5]) {
          pcVar3[uVar5] = ' ';
        }
      }
    }
    return;
  }
  __assert_fail("win && field && field->buf",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CursesDialog/form/frm_driver.c"
                ,0x184,"void Window_To_Buffer(WINDOW *, FIELD *)");
}

Assistant:

static void Window_To_Buffer(WINDOW * win, FIELD  * field)
{
  int pad;
  int len = 0;
  char *p;
  int row, height, width;
  
  assert(win && field && field->buf );

  pad = field->pad;
  p = field->buf;
  getmaxyx(win, height, width);

  for(row=0; (row < height) && (row < field->drows); row++ )
    {
      wmove( win, row, 0 );
      len += winnstr( win, p+len, field->dcols );
    }
  p[len] = '\0';

  /* replace visual padding character by blanks in buffer */
  if (pad != C_BLANK)
    {
      int i;
      for(i=0; i<len; i++, p++)
        {
          if (*p==pad) 
            *p = C_BLANK;
        }
    }
}